

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_glow.cpp
# Opt level: O0

int gl_CheckSpriteGlow(sector_t *sec,int lightlevel,DVector3 *pos)

{
  bool bVar1;
  double dVar2;
  double local_60;
  double lightfrac;
  undefined1 local_50 [4];
  int maxlight;
  double floordiff;
  FTexture *local_30;
  FTexture *tex;
  DVector3 *pDStack_20;
  FTextureID floorpic;
  DVector3 *pos_local;
  int lightlevel_local;
  sector_t *sec_local;
  
  pDStack_20 = pos;
  floordiff._4_4_ = sector_t::GetTexture(sec,0);
  tex._4_4_ = floordiff._4_4_;
  local_30 = FTextureManager::operator[](&TexMan,floordiff._4_4_);
  pos_local._4_4_ = lightlevel;
  if ((local_30 != (FTexture *)0x0) && (bVar1 = FTexture::isGlowing(local_30), bVar1)) {
    local_60 = pDStack_20->Z;
    TVector2<double>::TVector2((TVector2<double> *)local_50,pDStack_20);
    dVar2 = secplane_t::ZatPoint(&sec->floorplane,(DVector2 *)local_50);
    local_60 = local_60 - dVar2;
    if ((local_60 < (double)(local_30->gl_info).GlowHeight) && ((local_30->gl_info).GlowHeight != 0)
       ) {
      local_60 = local_60 / (double)(local_30->gl_info).GlowHeight;
      if (local_60 < 0.0) {
        local_60 = 0.0;
      }
      pos_local._4_4_ =
           (int)(local_60 * (double)lightlevel + (double)(lightlevel + 0xff >> 1) * (1.0 - local_60)
                );
    }
  }
  return pos_local._4_4_;
}

Assistant:

int gl_CheckSpriteGlow(sector_t *sec, int lightlevel, const DVector3 &pos)
{
	FTextureID floorpic = sec->GetTexture(sector_t::floor);
	FTexture *tex = TexMan[floorpic];
	if (tex != NULL && tex->isGlowing())
	{
		double floordiff = pos.Z - sec->floorplane.ZatPoint(pos);
		if (floordiff < tex->gl_info.GlowHeight && tex->gl_info.GlowHeight != 0)
		{
			int maxlight = (255 + lightlevel) >> 1;
			double lightfrac = floordiff / tex->gl_info.GlowHeight;
			if (lightfrac < 0) lightfrac = 0;
			lightlevel = int(lightfrac*lightlevel + maxlight*(1 - lightfrac));
		}
	}
	return lightlevel;
}